

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O0

string * __thiscall
m2d::savanna::get_endpoint::build_path_abi_cxx11_(string *__return_storage_ptr__,get_endpoint *this)

{
  bool bVar1;
  string local_b0 [32];
  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_90;
  string local_48 [39];
  undefined1 local_21;
  get_endpoint *local_20;
  get_endpoint *this_local;
  string *new_path;
  
  local_21 = 0;
  local_20 = this;
  this_local = (get_endpoint *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  (*(this->super_endpoint)._vptr_endpoint[4])(local_48);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_48);
  std::__cxx11::string::~string(local_48);
  (*(this->super_endpoint)._vptr_endpoint[3])(&local_90);
  new_path = (string *)&local_90;
  bVar1 = boost::
          optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::operator!((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)new_path);
  boost::
  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~optional(&local_90);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"?");
    (*(this->super_endpoint)._vptr_endpoint[7])(local_b0);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_b0);
    std::__cxx11::string::~string(local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string build_path()
		{
			std::string new_path;
			new_path += path();
			if (params()) {
				new_path += "?";
				new_path += param_str();
			}
			return new_path;
		}